

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateFolder(FilePath *this)

{
  char *__path;
  int iVar1;
  int result;
  FilePath *in_stack_00000080;
  undefined1 local_1;
  
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(__path,0x1ff);
  if (iVar1 == -1) {
    local_1 = DirectoryExists(in_stack_00000080);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool FilePath::CreateFolder() const {
#if GTEST_OS_WINDOWS_MOBILE
  FilePath removed_sep(this->RemoveTrailingPathSeparator());
  LPCWSTR unicode = String::AnsiToUtf16(removed_sep.c_str());
  int result = CreateDirectory(unicode, NULL) ? 0 : -1;
  delete [] unicode;
#elif GTEST_OS_WINDOWS
  int result = _mkdir(pathname_.c_str());
#else
  int result = mkdir(pathname_.c_str(), 0777);
#endif  // GTEST_OS_WINDOWS_MOBILE

  if (result == -1) {
    return this->DirectoryExists();  // An error is OK if the directory exists.
  }
  return true;  // No error.
}